

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::semantic_rule<jsonip::grammar::true_p,jsonip::grammar::true_t>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  PositionType pcVar1;
  bool bVar2;
  pair<const_char_*,_long> local_30;
  
  pcVar1 = state->reader_->pos_;
  bVar2 = seq_<jsonip::parser::char_<(char)116>,jsonip::parser::char_<(char)114>,jsonip::parser::char_<(char)117>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  if (bVar2) {
    local_30.second = (long)state->reader_->pos_ - (long)pcVar1;
    local_30.first = pcVar1;
    grammar::true_p::
    process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
              (state,&local_30);
  }
  return bVar2;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }